

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3StartNode(Blob *pNode,int iHeight,sqlite3_int64 iChild)

{
  int iVar1;
  sqlite3_int64 iChild_local;
  int iHeight_local;
  Blob *pNode_local;
  
  *pNode->a = (char)iHeight;
  if (iChild == 0) {
    pNode->n = 1;
  }
  else {
    iVar1 = sqlite3Fts3PutVarint(pNode->a + 1,iChild);
    pNode->n = iVar1 + 1;
  }
  return;
}

Assistant:

static void fts3StartNode(Blob *pNode, int iHeight, sqlite3_int64 iChild){
  pNode->a[0] = (char)iHeight;
  if( iChild ){
    assert( pNode->nAlloc>=1+sqlite3Fts3VarintLen(iChild) );
    pNode->n = 1 + sqlite3Fts3PutVarint(&pNode->a[1], iChild);
  }else{
    assert( pNode->nAlloc>=1 );
    pNode->n = 1;
  }
}